

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

Am_Wrapper * popup_sub_win_undo_handler_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object main_window;
  Am_Object for_item;
  Am_Value v;
  Am_Object undo_handler;
  
  for_item.data = (Am_Object_Data *)0x0;
  main_window.data = (Am_Object_Data *)0x0;
  undo_handler.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(self,0x1d3,0);
  Am_Object::operator=(&for_item,pAVar2);
  bVar1 = Am_Object::Valid(&for_item);
  if (bVar1) {
    v.type = 0;
    v.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar2 = Am_Object::Get(&for_item,0x68,1);
    Am_Value::operator=(&v,pAVar2);
    bVar1 = Am_Value::Valid(&v);
    if (bVar1) {
      Am_Object::operator=(&main_window,&v);
      bVar1 = Am_Object::Valid(&main_window);
      if (bVar1) {
        pAVar2 = Am_Object::Get(&main_window,0x174,1);
        Am_Value::operator=(&v,pAVar2);
        bVar1 = Am_Value::Valid(&v);
        if (bVar1) {
          Am_Object::operator=(&undo_handler,&v);
        }
      }
    }
    Am_Value::~Am_Value(&v);
  }
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&undo_handler);
  Am_Object::~Am_Object(&undo_handler);
  Am_Object::~Am_Object(&main_window);
  Am_Object::~Am_Object(&for_item);
  return pAVar3;
}

Assistant:

Am_Define_Object_Formula(popup_sub_win_undo_handler)
{
  Am_Object for_item, main_window, undo_handler;
  for_item = self.Get(Am_FOR_ITEM);
  if (for_item.Valid()) {
    Am_Value v;
    v = for_item.Peek(Am_WINDOW);
    if (v.Valid()) {
      main_window = v;
      if (main_window.Valid()) {
        v = main_window.Peek(Am_UNDO_HANDLER);
        if (v.Valid())
          undo_handler = v;
      }
    }
  }
  return undo_handler;
}